

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_yplus_lengthscale
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_INT RVar1;
  REF_STATUS RVar2;
  uint uVar3;
  int iVar4;
  void *__ptr;
  double dVar5;
  double dVar6;
  double dVar7;
  REF_DBL local_250;
  REF_DBL local_248;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL press;
  REF_DBL gamma;
  REF_DBL yplus_dist;
  REF_DBL t;
  REF_DBL rho;
  REF_DBL tangent [3];
  double local_1c8;
  REF_DBL edg_norm [3];
  REF_DBL dxyz [3];
  REF_DBL u1;
  REF_DBL u0;
  REF_DBL du;
  REF_DBL dn;
  REF_INT on_node;
  REF_INT off_node;
  REF_INT tri_list [2];
  REF_INT ntri;
  REF_INT tri_nodes [27];
  int local_e4;
  REF_INT edg_nodes [27];
  int local_74;
  REF_INT tri;
  REF_INT edg;
  REF_CELL tri_cell;
  REF_CELL edg_cell;
  REF_INT ref_malloc_init_i;
  REF_INT node;
  REF_INT *hits;
  REF_NODE ref_node;
  REF_DBL *lengthscale_local;
  REF_DBL *field_local;
  REF_INT ldim_local;
  REF_DBL reference_t_k_local;
  REF_DBL re_local;
  REF_DBL mach_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  for (edg_cell._4_4_ = 0; edg_cell._4_4_ < ref_node_00->max; edg_cell._4_4_ = edg_cell._4_4_ + 1) {
    if (((-1 < edg_cell._4_4_) && (edg_cell._4_4_ < ref_node_00->max)) &&
       (-1 < ref_node_00->global[edg_cell._4_4_])) {
      lengthscale[edg_cell._4_4_] = 0.0;
    }
  }
  if (ref_node_00->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2fc,
           "ref_phys_yplus_lengthscale","malloc hits of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_node_00->max << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2fc,
             "ref_phys_yplus_lengthscale","malloc hits of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (edg_cell._0_4_ = 0; (int)edg_cell < ref_node_00->max; edg_cell._0_4_ = (int)edg_cell + 1)
      {
        *(undefined4 *)((long)__ptr + (long)(int)edg_cell * 4) = 0;
      }
      if (ref_grid->twod == 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x332,"ref_phys_yplus_lengthscale",6,"implement 3D");
        ref_grid_local._4_4_ = 6;
      }
      else {
        ref_cell = ref_grid->cell[0];
        ref_cell_00 = ref_grid->cell[3];
        for (local_74 = 0; local_74 < ref_cell->max; local_74 = local_74 + 1) {
          RVar2 = ref_cell_nodes(ref_cell,local_74,tri_nodes + 0x1a);
          if (RVar2 == 0) {
            uVar3 = ref_layer_interior_seg_normal(ref_grid,local_74,&local_1c8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x309,"ref_phys_yplus_lengthscale",(ulong)uVar3,"edge norm");
              return uVar3;
            }
            uVar3 = ref_cell_list_with2(ref_grid->cell[3],tri_nodes[0x1a],local_e4,2,tri_list,
                                        &on_node);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x30c,"ref_phys_yplus_lengthscale",(ulong)uVar3,"tri with2");
              return uVar3;
            }
            if ((long)tri_list[0] != 1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x30d,"ref_phys_yplus_lengthscale","edg expects one tri",1,(long)tri_list[0]);
              return 1;
            }
            uVar3 = ref_cell_nodes(ref_cell_00,on_node,tri_list + 1);
            RVar1 = tri_nodes[0x1a];
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x30f,"ref_phys_yplus_lengthscale",(ulong)uVar3,"tri nodes");
              return uVar3;
            }
            iVar4 = ((tri_list[1] + ntri + tri_nodes[0]) - tri_nodes[0x1a]) - local_e4;
            rho = ref_node_00->real[local_e4 * 0xf] - ref_node_00->real[tri_nodes[0x1a] * 0xf];
            tangent[0] = ref_node_00->real[local_e4 * 0xf + 1] -
                         ref_node_00->real[tri_nodes[0x1a] * 0xf + 1];
            tangent[1] = ref_node_00->real[local_e4 * 0xf + 2] -
                         ref_node_00->real[tri_nodes[0x1a] * 0xf + 2];
            uVar3 = ref_math_normalize(&rho);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x319,"ref_phys_yplus_lengthscale",(ulong)uVar3,"normalize tangent");
              return uVar3;
            }
            local_248 = field[(long)(ldim * iVar4 + 1) + 2] * tangent[1] +
                        field[ldim * iVar4 + 1] * rho +
                        field[(long)(ldim * iVar4 + 1) + 1] * tangent[0];
            dVar5 = ref_node_00->real[iVar4 * 0xf] - ref_node_00->real[RVar1 * 0xf];
            dVar6 = ref_node_00->real[iVar4 * 0xf + 1] - ref_node_00->real[RVar1 * 0xf + 1];
            dVar7 = ref_node_00->real[iVar4 * 0xf + 2] - ref_node_00->real[RVar1 * 0xf + 2];
            if (0.0 - local_248 <= 0.0) {
              local_248 = -(0.0 - local_248);
            }
            else {
              local_248 = 0.0 - local_248;
            }
            if (dVar7 * edg_norm[1] + dVar5 * local_1c8 + dVar6 * edg_norm[0] <= 0.0) {
              local_250 = -(dVar7 * edg_norm[1] + dVar5 * local_1c8 + dVar6 * edg_norm[0]);
            }
            else {
              local_250 = dVar7 * edg_norm[1] + dVar5 * local_1c8 + dVar6 * edg_norm[0];
            }
            t = field[ldim * RVar1];
            yplus_dist = (field[ldim * RVar1 + 4] / t) * 1.4;
            uVar3 = ref_phys_yplus_dist(mach,re,reference_t_k,t,yplus_dist,local_250,local_248,
                                        &gamma);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x32b,"ref_phys_yplus_lengthscale",(ulong)uVar3,"yplus dist");
              return uVar3;
            }
            lengthscale[tri_nodes[0x1a]] = gamma + lengthscale[tri_nodes[0x1a]];
            *(int *)((long)__ptr + (long)tri_nodes[0x1a] * 4) =
                 *(int *)((long)__ptr + (long)tri_nodes[0x1a] * 4) + 1;
            lengthscale[local_e4] = gamma + lengthscale[local_e4];
            *(int *)((long)__ptr + (long)local_e4 * 4) =
                 *(int *)((long)__ptr + (long)local_e4 * 4) + 1;
          }
        }
        for (edg_cell._4_4_ = 0; edg_cell._4_4_ < ref_node_00->max;
            edg_cell._4_4_ = edg_cell._4_4_ + 1) {
          if (((-1 < edg_cell._4_4_) && (edg_cell._4_4_ < ref_node_00->max)) &&
             ((-1 < ref_node_00->global[edg_cell._4_4_] &&
              (0 < *(int *)((long)__ptr + (long)edg_cell._4_4_ * 4))))) {
            lengthscale[edg_cell._4_4_] =
                 lengthscale[edg_cell._4_4_] /
                 (double)*(int *)((long)__ptr + (long)edg_cell._4_4_ * 4);
          }
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        ref_grid_local._4_4_ = ref_node_ghost_dbl(ref_node_00,lengthscale,1);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x33b,"ref_phys_yplus_lengthscale",(ulong)ref_grid_local._4_4_,"ghost lengthscale")
          ;
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale(REF_GRID ref_grid, REF_DBL mach,
                                              REF_DBL re, REF_DBL reference_t_k,
                                              REF_INT ldim, REF_DBL *field,
                                              REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(field[1 + ldim * off_node]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  return REF_SUCCESS;
}